

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall HTTPRequestTracker::RemoveRequest(HTTPRequestTracker *this,evhttp_request *req)

{
  evhttp_connection *peVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  evhttp_request **ppeVar4;
  evhttp_connection **ppeVar5;
  long lVar6;
  ulong uVar7;
  _Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false> it;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  __hash_code __code;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  evhttp_request *local_40;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = req;
  ppeVar4 = inline_assertion_check<true,evhttp_request*&>
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                       ,0xb7,"RemoveRequest","req");
  local_38._M_device = (mutex_type *)evhttp_request_get_connection(*ppeVar4);
  ppeVar5 = inline_assertion_check<true,evhttp_connection*>
                      ((evhttp_connection **)&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                       ,0xb7,"RemoveRequest","evhttp_request_get_connection(Assert(req))");
  peVar1 = *ppeVar5;
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  uVar2 = (this->m_tracker)._M_h._M_bucket_count;
  uVar7 = (ulong)peVar1 % uVar2;
  p_Var8 = (this->m_tracker)._M_h._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var8->_M_nxt, p_Var9 = p_Var8,
     peVar1 != (evhttp_connection *)p_Var8->_M_nxt[1]._M_nxt)) {
    while (p_Var8 = p_Var3, p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar7) ||
         (p_Var9 = p_Var8, peVar1 == (evhttp_connection *)p_Var3[1]._M_nxt)) goto LAB_0046f845;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_0046f845:
  if (p_Var9 == (__node_base_ptr)0x0) {
    it._M_cur = (__node_type *)0x0;
  }
  else {
    it._M_cur = (__node_type *)p_Var9->_M_nxt;
  }
  if (((it._M_cur != (__node_type *)0x0) && (*(long *)((long)it._M_cur + 0x10) != 0)) &&
     (lVar6 = *(long *)((long)it._M_cur + 0x10) + -1, *(long *)((long)it._M_cur + 0x10) = lVar6,
     lVar6 == 0)) {
    RemoveConnectionInternal(this,(iterator)it._M_cur);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        const evhttp_connection* conn{Assert(evhttp_request_get_connection(Assert(req)))};
        LOCK(m_mutex);
        auto it{m_tracker.find(conn)};
        if (it != m_tracker.end() && it->second > 0) {
            if (--(it->second) == 0) RemoveConnectionInternal(it);
        }
    }